

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall CChat::OnReset(CChat *this)

{
  int iVar1;
  int iVar2;
  IClient *pIVar3;
  bool *pbVar4;
  array<bool,_allocator_default<bool>_> *in_RDI;
  FCommandCallback unaff_retaddr;
  char *in_stack_00000008;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  array<bool,_allocator_default<bool>_> *pContext;
  
  pContext = in_RDI;
  pIVar3 = CComponent::Client((CComponent *)0x14bd1c);
  iVar1 = IClient::State(pIVar3);
  if (iVar1 != 0) {
    pIVar3 = CComponent::Client((CComponent *)0x14bd33);
    iVar1 = IClient::State(pIVar3);
    if (iVar1 != 4) {
      for (local_18 = 0; local_18 < 0xfa; local_18 = local_18 + 1) {
        *(undefined4 *)((long)in_RDI + (long)local_18 * 0x268 + 700) = 0xbf800000;
      }
      goto LAB_0014bf6b;
    }
  }
  for (local_c = 0; local_c < 0xfa; local_c = local_c + 1) {
    *(undefined8 *)((long)in_RDI + (long)local_c * 0x268 + 0x2b0) = 0;
    *(undefined4 *)((long)in_RDI + (long)local_c * 0x268 + 700) = 0xbf800000;
    *(undefined1 *)((long)in_RDI + (long)local_c * 0x268 + 0x311) = 0;
    *(undefined1 *)((long)in_RDI + (long)local_c * 0x268 + 0x2d0) = 0;
  }
  Disable((CChat *)0x14bdf5);
  in_RDI[0x25c4].num_elements = -1;
  *(undefined1 *)&in_RDI[0x25c5].list = 0;
  *(undefined4 *)((long)&in_RDI[0x25c5].list + 4) = 0;
  in_RDI[0x25c5].list_size = -1;
  in_RDI[0x25c5].num_elements = -1;
  *(undefined1 *)&in_RDI[0x25c6].list = 0;
  *(undefined4 *)&in_RDI[0x25d6].list = 0;
  *(undefined4 *)((long)&in_RDI[0x25d6].list + 4) = 0;
  in_RDI[0x2637].list_size = 0;
  in_RDI[0x2637].num_elements = 0;
  in_RDI[0x363a].list_size = 0;
  in_RDI[0x363b].list = (bool *)0x0;
  *(undefined1 *)&in_RDI[0x363d].list = 0;
  *(undefined4 *)((long)&in_RDI[0x363d].list + 4) = 0;
  in_RDI[0x363d].list_size = 0;
  array<bool,_allocator_default<bool>_>::set_size(in_RDI,in_stack_ffffffffffffffdc);
  local_10 = 0;
  while (iVar1 = local_10, iVar2 = array<bool,_allocator_default<bool>_>::size(in_RDI + 0x363e),
        iVar1 < iVar2) {
    pbVar4 = array<bool,_allocator_default<bool>_>::operator[](in_RDI + 0x363e,local_10);
    *pbVar4 = false;
    local_10 = local_10 + 1;
  }
  *(undefined4 *)&in_RDI[0x363f].list = 0;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    *(undefined8 *)(&in_RDI[0x363b].list_size + (long)local_14 * 2) = 0;
  }
LAB_0014bf6b:
  in_RDI[0x25d6].num_elements = -0x40800000;
  pIVar3 = CComponent::Client((CComponent *)0x14bf85);
  iVar1 = IClient::State(pIVar3);
  if (iVar1 < 3) {
    CCommandManager::ClearCommands((CCommandManager *)0x14bfa7);
    CCommandManager::AddCommand
              ((CCommandManager *)this,_i_1,_i_3,in_stack_00000008,unaff_retaddr,pContext);
    CCommandManager::AddCommand
              ((CCommandManager *)this,_i_1,_i_3,in_stack_00000008,unaff_retaddr,pContext);
    CCommandManager::AddCommand
              ((CCommandManager *)this,_i_1,_i_3,in_stack_00000008,unaff_retaddr,pContext);
    CCommandManager::AddCommand
              ((CCommandManager *)this,_i_1,_i_3,in_stack_00000008,unaff_retaddr,pContext);
    CCommandManager::AddCommand
              ((CCommandManager *)this,_i_1,_i_3,in_stack_00000008,unaff_retaddr,pContext);
    CCommandManager::AddCommand
              ((CCommandManager *)this,_i_1,_i_3,in_stack_00000008,unaff_retaddr,pContext);
    CCommandManager::AddCommand
              ((CCommandManager *)this,_i_1,_i_3,in_stack_00000008,unaff_retaddr,pContext);
    CCommandManager::AddCommand
              ((CCommandManager *)this,_i_1,_i_3,in_stack_00000008,unaff_retaddr,pContext);
  }
  return;
}

Assistant:

void CChat::OnReset()
{
	if(Client()->State() == IClient::STATE_OFFLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		for(int i = 0; i < MAX_LINES; i++)
		{
			m_aLines[i].m_Time = 0;
			m_aLines[i].m_Size.y = -1.0f;
			m_aLines[i].m_aText[0] = '\0';
			m_aLines[i].m_aName[0] = '\0';
		}

		Disable();
		m_LastWhisperFrom = -1;
		m_Show = false;
		m_BacklogPage = 0;
		m_CompletionChosen = -1;
		m_CompletionFav = -1;
		m_aCompletionBuffer[0] = '\0';
		m_PlaceholderOffset = 0;
		m_PlaceholderLength = 0;
		m_pHistoryEntry = 0x0;
		m_PendingChatCounter = 0;
		m_LastChatSend = 0;

		m_IgnoreCommand = false;
		m_SelectedCommand = 0;
		m_CommandStart = 0;

		m_aFilter.set_size(8); //Should help decrease allocations
		for(int i = 0; i < m_aFilter.size(); i++)
			m_aFilter[i] = false;

		m_FilteredCount = 0;

		for(int i = 0; i < CHAT_NUM; ++i)
			m_aLastSoundPlayed[i] = 0;
	}
	else
	{
		for(int i = 0; i < MAX_LINES; i++)
		{
			m_aLines[i].m_Size.y = -1.0f;
		}
	}

	m_CurrentLineWidth = -1.0f;

	// init chat commands (must be in alphabetical order)
	if(Client()->State() < IClient::STATE_ONLINE)
	{
		m_CommandManager.ClearCommands();
		m_CommandManager.AddCommand("all", "Switch to all chat", "?r[message]", &Com_All, this);
		m_CommandManager.AddCommand("friend", "Add player as friend", "s[name]", &Com_Befriend, this);
		m_CommandManager.AddCommand("m", "Mute a player", "s[name]", &Com_Mute, this);
		m_CommandManager.AddCommand("mute", "Mute a player", "s[name]", &Com_Mute, this);
		m_CommandManager.AddCommand("r", "Reply to a whisper", "?r[message]", &Com_Reply, this);
		m_CommandManager.AddCommand("team", "Switch to team chat", "?r[message]", &Com_Team, this);
		m_CommandManager.AddCommand("w", "Whisper another player", "r[name]", &Com_Whisper, this);
		m_CommandManager.AddCommand("whisper", "Whisper another player", "r[name]", &Com_Whisper, this);
	}
}